

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferTextureBufferRange::initTest(TextureBufferTextureBufferRange *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  TextureBufferTextureBufferRange *pTVar5;
  NotSupportedError *this_00;
  uint uVar6;
  ulong uVar7;
  GLuint offset;
  TextureBufferTextureBufferRange *this_01;
  TextureBufferTextureBufferRange *pTVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> formats;
  allocator_type local_101;
  long local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_OFFSET_ALIGNMENT,
               &this->m_texture_buffer_offset_alignment);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error getting GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT parameter value!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x25d);
    formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8229;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x822d;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x822e;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8231;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8233;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8235;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8232;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8234;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8236;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x822b;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x822f;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8230;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8237;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8239;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x823b;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8238;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x823a;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x823c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8815;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d83;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d71;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8058;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x881a;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8814;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d8e;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d82;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d7c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d76;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8d70;
    local_100 = lVar3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&formats,(uint *)&buffer);
    uVar6 = 0;
    while( true ) {
      uVar7 = (ulong)uVar6;
      if ((ulong)((long)formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar7) break;
      FormatInfo::FormatInfo
                ((FormatInfo *)&buffer,
                 formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7],this->m_texture_buffer_offset_alignment);
      pmVar4 = std::
               map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
               ::operator[](&this->m_configurations,
                            formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar7);
      FormatInfo::operator=(pmVar4,(FormatInfo *)&buffer);
      FormatInfo::~FormatInfo((FormatInfo *)&buffer);
      pmVar4 = std::
               map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
               ::operator[](&this->m_configurations,
                            formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar7);
      this->m_buffer_total_size = this->m_buffer_total_size + pmVar4->m_aligned_size;
      uVar6 = uVar6 + 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&buffer,(ulong)this->m_buffer_total_size,&local_101);
    this_01 = (TextureBufferTextureBufferRange *)
              CONCAT44(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_);
    offset = 0;
    memset(this_01,0,(ulong)this->m_buffer_total_size);
    pTVar8 = (TextureBufferTextureBufferRange *)
             (this->m_configurations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (lVar3 = local_100,
          pTVar8 != (TextureBufferTextureBufferRange *)
                    &(this->m_configurations)._M_t._M_impl.super__Rb_tree_header) {
      fillInputData(this_01,(GLubyte *)
                            CONCAT44(buffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     buffer.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_),offset,
                    (FormatInfo *)
                    ((long)&(pTVar8->super_TestCaseBase).super_TestCase.super_TestNode.m_name.
                            field_2 + 8));
      offset = offset + *(int *)((long)&(pTVar8->super_TestCaseBase).super_TestCase.super_TestNode.
                                        m_name.field_2 + 8);
      pTVar5 = (TextureBufferTextureBufferRange *)
               std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar8);
      this_01 = pTVar8;
      pTVar8 = pTVar5;
    }
    (**(code **)(local_100 + 0x708))(1,&this->m_vao_id);
    (**(code **)(lVar3 + 0xd8))(this->m_vao_id);
    (**(code **)(lVar3 + 0x6c8))(1,&this->m_tbo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x299);
    (**(code **)(lVar3 + 0x40))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error binding buffer object !",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x29b);
    (**(code **)(lVar3 + 0x150))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_buffer_total_size,
               CONCAT44(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_),0x88e4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error allocating buffer object\'s data store!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x29d);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Texture buffer functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
             ,0x256);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferTextureBufferRange::initTest(void)
{
	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.getIntegerv(m_glExtTokens.TEXTURE_BUFFER_OFFSET_ALIGNMENT, &m_texture_buffer_offset_alignment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT parameter value!");

	/* Create list of textures internal formats */
	std::vector<glw::GLenum> formats;

	formats.push_back(GL_R8);
	formats.push_back(GL_R16F);
	formats.push_back(GL_R32F);
	formats.push_back(GL_R8I);
	formats.push_back(GL_R16I);
	formats.push_back(GL_R32I);
	formats.push_back(GL_R8UI);
	formats.push_back(GL_R16UI);
	formats.push_back(GL_R32UI);
	formats.push_back(GL_RG8);
	formats.push_back(GL_RG16F);
	formats.push_back(GL_RG32F);
	formats.push_back(GL_RG8I);
	formats.push_back(GL_RG16I);
	formats.push_back(GL_RG32I);
	formats.push_back(GL_RG8UI);
	formats.push_back(GL_RG16UI);
	formats.push_back(GL_RG32UI);
	formats.push_back(GL_RGB32F);
	formats.push_back(GL_RGB32I);
	formats.push_back(GL_RGB32UI);
	formats.push_back(GL_RGBA8);
	formats.push_back(GL_RGBA16F);
	formats.push_back(GL_RGBA32F);
	formats.push_back(GL_RGBA8I);
	formats.push_back(GL_RGBA16I);
	formats.push_back(GL_RGBA32I);
	formats.push_back(GL_RGBA8UI);
	formats.push_back(GL_RGBA16UI);
	formats.push_back(GL_RGBA32UI);

	/* Create configuration for internal formats and add them to the map */
	for (glw::GLuint i = 0; i < formats.size(); ++i)
	{
		m_configurations[formats[i]] = FormatInfo(formats[i], m_texture_buffer_offset_alignment);
		m_buffer_total_size += m_configurations[formats[i]].get_aligned_size();
	}

	std::vector<glw::GLubyte> buffer(m_buffer_total_size);
	memset(&buffer[0], 0, m_buffer_total_size);

	glw::GLuint offset = 0;
	for (std::map<glw::GLenum, FormatInfo>::iterator it = m_configurations.begin(); it != m_configurations.end(); ++it)
	{
		FormatInfo& info = it->second;
		fillInputData(&buffer[0], offset, info);
		offset += info.get_aligned_size();
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	/* Create buffer object */
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object !");
	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_buffer_total_size, &buffer[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");
}